

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
CBucket::insert(CBucket *this,AbstractSearchState *AbstractSearchState1,int priority)

{
  int iVar1;
  size_type sVar2;
  int in_EDX;
  vector<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_> *in_RSI;
  long *in_RDI;
  int in_stack_0000000c;
  int bucketindex;
  
  iVar1 = in_EDX - (int)in_RDI[4];
  if (in_EDX == 1000000000) {
    iVar1 = *(int *)((long)in_RDI + 0x24) + -1;
  }
  else if (*(int *)((long)in_RDI + 0x24) + -2 <= iVar1) {
    iVar1 = *(int *)((long)in_RDI + 0x24) + -2;
  }
  std::vector<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>::push_back
            (in_RSI,(value_type *)CONCAT44(in_EDX,iVar1));
  sVar2 = std::vector<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>::size
                    ((vector<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_> *)
                     (*in_RDI + (long)iVar1 * 0x18));
  *(int *)&(in_RSI->
           super__Vector_base<AbstractSearchState_*,_std::allocator<AbstractSearchState_*>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage = (int)sVar2 + -1;
  if (iVar1 == *(int *)((long)in_RDI + 0x24) + -2) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RSI,
               (value_type_conflict1 *)CONCAT44(in_EDX,iVar1));
    iVar1 = *(int *)((long)in_RDI + 0x34);
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
    if (iVar1 < (int)sVar2) {
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 1));
      *(int *)((long)in_RDI + 0x34) = (int)sVar2;
    }
  }
  if ((in_EDX < *(int *)((long)in_RDI + 0x2c)) || (*(int *)((long)in_RDI + 0x2c) == 1000000000)) {
    recomputeminelementupfrombucket((CBucket *)CONCAT44(priority,bucketindex),in_stack_0000000c);
  }
  return;
}

Assistant:

void insert(AbstractSearchState *AbstractSearchState1, int priority)
    {
        //compute bucket index
        int bucketindex = priority - firstpriority;
        if (priority == INFINITECOST) {
            bucketindex = numofbuckets - 1;
        }
        else if (bucketindex >= numofbuckets - 2) {
            bucketindex = numofbuckets - 2; //overflow bucket
        }

        //insert the element itself
        bucketV[bucketindex].push_back(AbstractSearchState1);
        AbstractSearchState1->heapindex = (int)bucketV[bucketindex].size() - 1;

        if (bucketindex == numofbuckets - 2) {
            assortedpriorityV.push_back(priority);

            if (maxassortedpriorityVsize < (int)assortedpriorityV.size()) maxassortedpriorityVsize
                = (int)assortedpriorityV.size();
        }

        //re-compute minelement if necessary
        if (priority < currentminelement_priority || currentminelement_priority == INFINITECOST) {
            recomputeminelementupfrombucket(bucketindex);
        }
    }